

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *ppbVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  const_reference __in;
  type *__rhs;
  char *pcVar5;
  size_type sVar6;
  ulong uVar7;
  const_reference pvVar8;
  undefined8 uVar9;
  reference pbVar10;
  undefined8 uVar11;
  reference pvVar12;
  ostream *poVar13;
  basic_ofstream<char,_std::char_traits<char>_> *stream;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  *__range1_3;
  undefined1 local_a10 [40];
  DDSHeader header_1;
  ifstream file_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_name_3;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  undefined1 local_710 [44];
  KTXHeader ktx_header;
  ifstream file_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_name_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  allocator local_461;
  string local_460 [32];
  string local_440 [32];
  undefined1 local_420 [8];
  PvrLegacyHeader pvr_legacy_header;
  PvrV3Header pvr_header;
  IHeader *header;
  ifstream local_3a0 [4];
  uint file_type;
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_name_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_170 [8];
  string error_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_title;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  column_titles;
  ofstream *output;
  string *output_name;
  uint index_1;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  output_streams;
  string local_e0 [32];
  string local_c0 [8];
  string ext_name;
  allocator local_99;
  string local_98 [8];
  string file_name;
  uint local_74;
  uint index;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dds_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ktx_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pvr_files;
  char **argv_local;
  int argc_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ktx_files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&dds_files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60);
  if (argc == 1) {
    PrintHelp();
  }
  else {
    for (local_74 = 1; local_74 < (uint)argc; local_74 = local_74 + 1) {
      iVar4 = strcmp(argv[local_74],"/?");
      if (((iVar4 == 0) || (iVar4 = strcmp(argv[local_74],"-h"), iVar4 == 0)) ||
         (iVar4 = strcmp(argv[local_74],"--help"), iVar4 == 0)) {
        PrintHelp();
      }
      pcVar5 = argv[local_74];
      __in = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&ParameterInfo_abi_cxx11_,0);
      __rhs = std::get<0ul,std::__cxx11::string,std::__cxx11::string>(__in);
      bVar2 = std::operator==(pcVar5,__rhs);
      if (bVar2) {
        s_parameters.print_csv = true;
      }
      else {
        pcVar5 = argv[local_74];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,pcVar5,&local_99);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_e0,pcVar5,
                   (allocator *)
                   ((long)&output_streams.
                           super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        GetFilenameExt(local_c0);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&output_streams.
                           super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        bVar2 = std::operator==(local_c0,"pvr");
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ktx_files.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_98)
          ;
        }
        else {
          bVar2 = std::operator==(local_c0,"ktx");
          if (bVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&dds_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (value_type *)local_98);
          }
          else {
            bVar2 = std::operator==(local_c0,"dds");
            if (bVar2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_60,(value_type *)local_98);
            }
          }
        }
        std::__cxx11::string::~string((string *)local_c0);
        std::__cxx11::string::~string(local_98);
      }
    }
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)Defaults::kCsvNames_abi_cxx11_);
    std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>::allocator
              ((allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
               ((long)&output_name + 7));
    std::
    vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::vector((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
              *)&index_1,sVar6,
             (allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
             ((long)&output_name + 7));
    std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>::~allocator
              ((allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
               ((long)&output_name + 7));
    if ((s_parameters.print_csv & 1U) != 0) {
      for (output_name._0_4_ = 0; uVar7 = (ulong)(uint)output_name,
          sVar6 = std::
                  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                          *)&index_1), uVar7 < sVar6; output_name._0_4_ = (uint)output_name + 1) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)Defaults::kCsvNames_abi_cxx11_,(ulong)(uint)output_name);
        column_titles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      ::at((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            *)&index_1,(ulong)(uint)output_name);
        std::ofstream::open((string *)
                            column_titles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(_Ios_Openmode)pvVar8
                           );
        bVar3 = std::ofstream::is_open();
        if ((bVar3 & 1) == 0) {
          uVar9 = std::__cxx11::string::c_str();
          printf("ERROR: Unable to open %s",uVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
        switch((uint)output_name) {
        case 0:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)PvrV3Info::column_names_abi_cxx11_);
          break;
        case 1:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)PvrLegacyInfo::column_names_abi_cxx11_);
          break;
        case 2:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)KTXInfo::column_names_abi_cxx11_);
          break;
        case 3:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)DDSInfo::column_names_abi_cxx11_);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/joedavisdev[P]textureinfo/main.cpp"
                        ,0x94,"int main(int, char **)");
        }
        poVar13 = std::operator<<((ostream *)
                                  column_titles.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"File name");
        std::operator<<(poVar13,',');
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
        column_title = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range3);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&column_title), bVar2) {
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
          poVar13 = std::operator<<((ostream *)
                                    column_titles.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (string *)pbVar10);
          std::operator<<(poVar13,',');
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        std::ostream::operator<<
                  ((ostream *)
                   column_titles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   std::endl<char,std::char_traits<char>>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"",(allocator *)((long)&__range1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    ppbVar1 = &ktx_files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)ppbVar1);
    file_name_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)ppbVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file_name_1), bVar2) {
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
      std::ifstream::ifstream(local_3a0,(string *)pbVar10,_S_bin);
      bVar3 = std::ifstream::is_open();
      if ((bVar3 & 1) == 0) {
        uVar9 = std::__cxx11::string::c_str();
        printf("ERROR: Unable to open %s\n",uVar9);
      }
      else {
        pvr_header.impl_.mip_map_count = 0;
        pvr_header.impl_.meta_data_size = 0;
        PvrV3Header::PvrV3Header((PvrV3Header *)&pvr_legacy_header.impl_v2_);
        PvrLegacyHeader::PvrLegacyHeader((PvrLegacyHeader *)local_420);
        bVar2 = PvrV3Header::LoadHeader
                          ((PvrV3Header *)&pvr_legacy_header.impl_v2_,local_3a0,(string *)local_170)
        ;
        if (bVar2) {
          pvr_header.impl_._40_8_ = &pvr_legacy_header.impl_v2_;
        }
        header._4_4_ = (uint)!bVar2;
        if (pvr_header.impl_._40_8_ == 0) {
          bVar2 = PvrLegacyHeader::LoadHeader
                            ((PvrLegacyHeader *)local_420,local_3a0,(string *)local_170);
          if (!bVar2) {
            uVar9 = std::__cxx11::string::c_str();
            uVar11 = std::__cxx11::string::c_str();
            printf("ERROR: %s - %s\n",uVar9,uVar11);
            goto LAB_0013b17d;
          }
          pvr_header.impl_._40_8_ = local_420;
        }
        if ((s_parameters.print_csv & 1U) == 0) {
          pcVar5 = "PVR (legacy)";
          if (header._4_4_ == 0) {
            pcVar5 = "PVR (v3)";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_460,pcVar5,&local_461);
          (**(code **)(*(long *)pvr_header.impl_._40_8_ + 8))(&__range1_1);
          PrintHeaderInfo(pbVar10,(string *)local_460,(string *)&__range1_1);
          std::__cxx11::string::~string((string *)&__range1_1);
          std::__cxx11::string::~string(local_460);
          std::allocator<char>::~allocator((allocator<char> *)&local_461);
        }
        else {
          pvVar12 = std::
                    vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                    ::operator[]((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                  *)&index_1,(ulong)header._4_4_);
          poVar13 = std::operator<<((ostream *)pvVar12,(string *)pbVar10);
          poVar13 = std::operator<<(poVar13,",");
          (**(code **)(*(long *)pvr_header.impl_._40_8_ + 0x10))(local_440);
          poVar13 = std::operator<<(poVar13,local_440);
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_440);
        }
      }
LAB_0013b17d:
      std::ifstream::~ifstream(local_3a0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    ppbVar1 = &dds_files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar1);
    file_name_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)ppbVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&file_name_2), bVar2) {
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
      std::ifstream::ifstream(&ktx_header.impl_.number_of_mipmap_levels,(string *)pbVar10,_S_bin);
      bVar3 = std::ifstream::is_open();
      if ((bVar3 & 1) == 0) {
        uVar9 = std::__cxx11::string::c_str();
        printf("ERROR: Unable to open %s\n",uVar9);
      }
      else {
        KTXHeader::KTXHeader((KTXHeader *)(local_710 + 0x24));
        bVar2 = KTXHeader::LoadHeader
                          ((KTXHeader *)(local_710 + 0x24),
                           (ifstream *)&ktx_header.impl_.number_of_mipmap_levels,(string *)local_170
                          );
        if (bVar2) {
          if ((s_parameters.print_csv & 1U) == 0) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)Defaults::kContainerNames_abi_cxx11_,2);
            KTXHeader::ToString_abi_cxx11_((KTXHeader *)&__range1_2);
            PrintHeaderInfo(pbVar10,pvVar8,(string *)&__range1_2);
            std::__cxx11::string::~string((string *)&__range1_2);
          }
          else {
            pvVar12 = std::
                      vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      ::at((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            *)&index_1,2);
            poVar13 = std::operator<<((ostream *)pvVar12,(string *)pbVar10);
            poVar13 = std::operator<<(poVar13,",");
            KTXHeader::ToCsvString_abi_cxx11_((KTXHeader *)local_710);
            poVar13 = std::operator<<(poVar13,(string *)local_710);
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)local_710);
          }
        }
        else {
          uVar9 = std::__cxx11::string::c_str();
          uVar11 = std::__cxx11::string::c_str();
          printf("ERROR: %s - %s\n",uVar9,uVar11);
        }
      }
      std::ifstream::~ifstream(&ktx_header.impl_.number_of_mipmap_levels);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    __end1_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_60);
    file_name_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_60);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&file_name_3), bVar2) {
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_2);
      std::ifstream::ifstream(&header_1.dx10_impl_.array_size,(string *)pbVar10,_S_bin);
      bVar3 = std::ifstream::is_open();
      if ((bVar3 & 1) == 0) {
        uVar9 = std::__cxx11::string::c_str();
        printf("ERROR: Unable to open %s\n",uVar9);
      }
      else {
        DDSHeader::DDSHeader((DDSHeader *)(local_a10 + 0x20));
        bVar2 = DDSHeader::LoadHeader
                          ((DDSHeader *)(local_a10 + 0x20),
                           (ifstream *)&header_1.dx10_impl_.array_size,(string *)local_170);
        if (bVar2) {
          if ((s_parameters.print_csv & 1U) == 0) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)Defaults::kContainerNames_abi_cxx11_,3);
            DDSHeader::ToString_abi_cxx11_((DDSHeader *)&__range1_3);
            PrintHeaderInfo(pbVar10,pvVar8,(string *)&__range1_3);
            std::__cxx11::string::~string((string *)&__range1_3);
          }
          else {
            pvVar12 = std::
                      vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      ::at((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            *)&index_1,3);
            poVar13 = std::operator<<((ostream *)pvVar12,(string *)pbVar10);
            poVar13 = std::operator<<(poVar13,",");
            DDSHeader::ToCsvString_abi_cxx11_((DDSHeader *)local_a10);
            poVar13 = std::operator<<(poVar13,(string *)local_a10);
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)local_a10);
          }
        }
        else {
          uVar9 = std::__cxx11::string::c_str();
          uVar11 = std::__cxx11::string::c_str();
          printf("ERROR: %s - %s\n",uVar9,uVar11);
        }
      }
      std::ifstream::~ifstream(&header_1.dx10_impl_.array_size);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_2);
    }
    __end1_3 = std::
               vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               ::begin((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                        *)&index_1);
    stream = (basic_ofstream<char,_std::char_traits<char>_> *)
             std::
             vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ::end((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                    *)&index_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
                               *)&stream), bVar2) {
      __gnu_cxx::
      __normal_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
      ::operator*(&__end1_3);
      std::ofstream::close();
      __gnu_cxx::
      __normal_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&__end1_3);
    }
    std::__cxx11::string::~string(local_170);
    std::
    vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::~vector((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               *)&index_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dds_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ktx_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main (int argc, char *argv[]) {
  std::vector<std::string> pvr_files, ktx_files, dds_files;
  //*-------------------------------
  // Loop through args
  //-------------------------------*/
  if(argc == 1) {
    PrintHelp();
    return 0;
  }
  for(unsigned int index = 1; index < argc; index++) {
    // Flags
    if(strcmp(argv[index], "/?") == 0 ||
    strcmp(argv[index], "-h") == 0 ||
    strcmp(argv[index], "--help") == 0) {
      PrintHelp();
    }
    if(argv[index] == std::get<0>(ParameterInfo[0])) {
      s_parameters.print_csv = true;
      continue;
    }
    // Files
    std::string file_name(argv[index]);
    std::string ext_name(GetFilenameExt(file_name.c_str()));
    if(ext_name == "pvr") {
      pvr_files.push_back(std::move(file_name));
    }
    else if(ext_name == "ktx") {
      ktx_files.push_back(std::move(file_name));
    }
    else if(ext_name == "dds") {
      dds_files.push_back(std::move(file_name));
    }
  }
  //*-------------------------------
  // CSV setup
  //-------------------------------*/
  std::vector<std::ofstream> output_streams(Defaults::kCsvNames.size());
  if(s_parameters.print_csv) {
    for(unsigned int index = 0; index < output_streams.size(); ++index) {
      const std::string& output_name(Defaults::kCsvNames.at(index));
      std::ofstream& output(output_streams.at(index));
      output.open(output_name);
      if(!output.is_open()) {
        printf("ERROR: Unable to open %s", output_name.c_str());
      }
      std::vector<std::string> column_titles;
      switch (index) {
        case Defaults::Types::PVRV3:
          column_titles = PvrV3Info::column_names;
          break;
        case Defaults::Types::PVRLegacy:
          column_titles = PvrLegacyInfo::column_names;
          break;
        case Defaults::Types::KTX:
          column_titles = KTXInfo::column_names;
          break;
          case Defaults::Types::DDS:
          column_titles = DDSInfo::column_names;
          break;
        default:
          assert(0);
          break;
      }
      output << "File name" << ',';
      for(auto& column_title : column_titles)
        output << column_title << ',';
      output << std::endl;
    }
  }
  //*-------------------------------
  // Load files & print
  //-------------------------------*/
  std::string error_string("");
  // PVR files
  for(const auto& file_name: pvr_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    unsigned int file_type(Defaults::Types::PVRV3);
    IHeader* header(nullptr);
    PvrV3Header pvr_header;
    PvrLegacyHeader pvr_legacy_header;
    // PVR v3
    if(pvr_header.LoadHeader(file, error_string)) header = &pvr_header;
    else file_type = Defaults::Types::PVRLegacy;
    // Legacy container
    if(header == nullptr) {
      if(pvr_legacy_header.LoadHeader(file, error_string)) {
        header = &pvr_legacy_header;
      }
      else {
        printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
      }
    }
    // Print
    if(s_parameters.print_csv)
      output_streams[file_type] << file_name << "," << header->ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        file_type == Defaults::Types::PVRV3?"PVR (v3)":"PVR (legacy)",
        header->ToString());
  }
  // KTX files
  for(const auto& file_name: ktx_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    KTXHeader ktx_header;
    if(!ktx_header.LoadHeader(file, error_string)) {
      printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
    }
    // Print
    if(s_parameters.print_csv)
      output_streams.at(Defaults::Types::KTX) << file_name << "," << ktx_header.ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        Defaults::kContainerNames.at(Defaults::Types::KTX),
        ktx_header.ToString());
  }
  // DDS files
  for(const auto& file_name: dds_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    DDSHeader header;
    if(!header.LoadHeader(file, error_string)) {
      printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
    }
    // Print
    if(s_parameters.print_csv)
      output_streams.at(Defaults::Types::DDS) << file_name << "," << header.ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        Defaults::kContainerNames.at(Defaults::Types::DDS),
        header.ToString());
  }
  
  // Shutdown
  for(auto& stream:output_streams)
    stream.close();
}